

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O2

void __thiscall hrgls::datablob::DataBlobSource::~DataBlobSource(DataBlobSource *this)

{
  DataBlobSource_private *pDVar1;
  
  pDVar1 = this->m_private;
  if (pDVar1 == (DataBlobSource_private *)0x0) {
LAB_00104ad7:
    pDVar1 = (DataBlobSource_private *)0x0;
  }
  else {
    if (pDVar1->m_stream != (hrgls_DataBlobSource)0x0) {
      hrgls_DataBlobSourceDestroy();
      pDVar1 = this->m_private;
      if (pDVar1 == (DataBlobSource_private *)0x0) goto LAB_00104ad7;
    }
    std::
    _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_int>,_std::_Select1st<std::pair<const_std::thread::id,_int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
    ::~_Rb_tree(&(pDVar1->m_status)._M_t);
  }
  operator_delete(pDVar1);
  return;
}

Assistant:

DataBlobSource::~DataBlobSource()
    {
      // Destroy any API object we created.
      if (m_private && m_private->m_stream) {
        hrgls_DataBlobSourceDestroy(m_private->m_stream);
      }
      delete m_private;
    }